

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resampler.c
# Opt level: O0

void Resmpl_Exec_LinearUp(RESMPL_STATE *CAA,UINT32 length,WAVE_32BS *retSample)

{
  uint uVar1;
  int iVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  UINT64 ChipSmpRateFP;
  INT32 SmpCnt;
  INT64 TempSmpR;
  INT64 TempSmpL;
  SLINT InPosL;
  UINT32 InNow;
  UINT32 InPre;
  UINT32 SmpFrc;
  UINT32 OutPos;
  UINT32 InPos;
  UINT32 InBase;
  DEV_SMPL *StreamPnt [2];
  DEV_SMPL *CurBufR;
  DEV_SMPL *CurBufL;
  WAVE_32BS *retSample_local;
  UINT32 length_local;
  RESMPL_STATE *CAA_local;
  
  uVar1 = CAA->smpRateSrc;
  for (InPre = 0; InPre < length; InPre = InPre + 1) {
    uVar8 = (uint)(((ulong)CAA->smpP * (ulong)uVar1 * 0x800) / (ulong)CAA->smpRateDst);
    uVar5 = uVar8 + 0x7ff >> 0xb;
    Resmpl_EnsureBuffers(CAA,(uVar5 - CAA->smpNext) + 2);
    pDVar3 = CAA->smplBufs[0];
    pDVar4 = CAA->smplBufs[1];
    *pDVar3 = (CAA->lSmpl).L;
    *pDVar4 = (CAA->lSmpl).R;
    pDVar3[1] = (CAA->nSmpl).L;
    pDVar4[1] = (CAA->nSmpl).R;
    if (uVar5 != CAA->smpNext) {
      _InPos = pDVar3 + 2;
      StreamPnt[0] = pDVar4 + 2;
      (*CAA->StreamUpdate)(CAA->su_DataPtr,uVar5 - CAA->smpNext,(DEV_SMPL **)&InPos);
    }
    iVar6 = uVar8 + CAA->smpNext * -0x800;
    uVar7 = iVar6 + 0x800;
    CAA->smpLast = uVar8 >> 0xb;
    CAA->smpNext = uVar5;
    uVar8 = uVar7 >> 0xb;
    uVar5 = iVar6 + 0xfffU >> 0xb;
    uVar7 = uVar7 & 0x7ff;
    iVar6 = pDVar4[uVar8];
    iVar2 = pDVar4[uVar5];
    retSample[InPre].L =
         (int)((long)(((long)pDVar3[uVar8] * (ulong)(0x800 - uVar7) +
                      (long)pDVar3[uVar5] * (ulong)uVar7) * (long)CAA->volumeL) / 0x800) +
         retSample[InPre].L;
    retSample[InPre].R =
         (int)((long)(((long)iVar6 * (ulong)(0x800 - uVar7) + (long)iVar2 * (ulong)uVar7) *
                     (long)CAA->volumeR) / 0x800) + retSample[InPre].R;
    (CAA->lSmpl).L = pDVar3[uVar8];
    (CAA->lSmpl).R = pDVar4[uVar8];
    (CAA->nSmpl).L = pDVar3[uVar5];
    (CAA->nSmpl).R = pDVar4[uVar5];
    CAA->smpP = CAA->smpP + 1;
  }
  if (CAA->smpRateSrc <= CAA->smpLast) {
    CAA->smpLast = CAA->smpLast - CAA->smpRateSrc;
    CAA->smpNext = CAA->smpNext - CAA->smpRateSrc;
    CAA->smpP = CAA->smpP - CAA->smpRateDst;
  }
  return;
}

Assistant:

static void Resmpl_Exec_LinearUp(RESMPL_STATE* CAA, UINT32 length, WAVE_32BS* retSample)
{
	// RESALGO_LINEAR_UP: Linear Upsampling
	DEV_SMPL* CurBufL;
	DEV_SMPL* CurBufR;
	DEV_SMPL* StreamPnt[0x02];
	UINT32 InBase;
	UINT32 InPos;
	UINT32 OutPos;
	UINT32 SmpFrc;	// Sample Fraction
	UINT32 InPre;
	UINT32 InNow;
	SLINT InPosL;
	INT64 TempSmpL;
	INT64 TempSmpR;
	INT32 SmpCnt;	// must be signed, else I'm getting calculation errors
	UINT64 ChipSmpRateFP;
	
	ChipSmpRateFP = FIXPNT_FACT * (UINT64)CAA->smpRateSrc;
	// TODO: Make it work *properly* with large blocks. (this is very hackish)
	for (OutPos = 0; OutPos < length; OutPos ++)
	{
		InPosL = (SLINT)(CAA->smpP * ChipSmpRateFP / CAA->smpRateDst);
		InPre = (UINT32)fp2i_floor(InPosL);
		InNow = (UINT32)fp2i_ceil(InPosL);
		
		Resmpl_EnsureBuffers(CAA, InNow - CAA->smpNext + 2);
		CurBufL = CAA->smplBufs[0];
		CurBufR = CAA->smplBufs[1];
		
		CurBufL[0] = CAA->lSmpl.L;
		CurBufR[0] = CAA->lSmpl.R;
		CurBufL[1] = CAA->nSmpl.L;
		CurBufR[1] = CAA->nSmpl.R;
		if (InNow != CAA->smpNext)
		{
			StreamPnt[0] = &CurBufL[2];
			StreamPnt[1] = &CurBufR[2];
			CAA->StreamUpdate(CAA->su_DataPtr, InNow - CAA->smpNext, StreamPnt);
		}
		
		InBase = FIXPNT_FACT + (UINT32)(InPosL - (SLINT)CAA->smpNext * FIXPNT_FACT);
		SmpCnt = FIXPNT_FACT;
		CAA->smpLast = InPre;
		CAA->smpNext = InNow;
		//for (OutPos = 0; OutPos < length; OutPos ++)
		//{
		//InPos = InBase + (UINT32)(OutPos * ChipSmpRateFP / CAA->smpRateDst);
		InPos = InBase;
		
		InPre = fp2i_floor(InPos);
		InNow = fp2i_ceil(InPos);
		SmpFrc = getfraction(InPos);
		
		// Linear interpolation
		TempSmpL = ((INT64)CurBufL[InPre] * (FIXPNT_FACT - SmpFrc)) +
					((INT64)CurBufL[InNow] * SmpFrc);
		TempSmpR = ((INT64)CurBufR[InPre] * (FIXPNT_FACT - SmpFrc)) +
					((INT64)CurBufR[InNow] * SmpFrc);
		retSample[OutPos].L += (INT32)(TempSmpL * CAA->volumeL / SmpCnt);
		retSample[OutPos].R += (INT32)(TempSmpR * CAA->volumeR / SmpCnt);
		//}
		CAA->lSmpl.L = CurBufL[InPre];
		CAA->lSmpl.R = CurBufR[InPre];
		CAA->nSmpl.L = CurBufL[InNow];
		CAA->nSmpl.R = CurBufR[InNow];
		CAA->smpP ++;
	}
	
	if (CAA->smpLast >= CAA->smpRateSrc)
	{
		CAA->smpLast -= CAA->smpRateSrc;
		CAA->smpNext -= CAA->smpRateSrc;
		CAA->smpP -= CAA->smpRateDst;
	}
	
	return;
}